

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::LoopLayerParams::InternalSwap(LoopLayerParams *this,LoopLayerParams *other)

{
  Arena *rhs_arena_00;
  Arena *lhs_arena_00;
  string *default_value;
  Arena *rhs_arena;
  Arena *lhs_arena;
  LoopLayerParams *other_local;
  LoopLayerParams *this_local;
  
  rhs_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  lhs_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&other->super_MessageLite);
  google::protobuf::internal::InternalMetadata::InternalSwap
            (&(this->super_MessageLite)._internal_metadata_,
             &(other->super_MessageLite)._internal_metadata_);
  default_value = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::InternalSwap
            (default_value,&this->conditionvar_,rhs_arena_00,&other->conditionvar_,lhs_arena_00);
  google::protobuf::internal::memswap<24>
            ((char *)&this->conditionnetwork_,(char *)&other->conditionnetwork_);
  return;
}

Assistant:

void LoopLayerParams::InternalSwap(LoopLayerParams* other) {
  using std::swap;
  auto* lhs_arena = GetArenaForAllocation();
  auto* rhs_arena = other->GetArenaForAllocation();
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &conditionvar_, lhs_arena,
      &other->conditionvar_, rhs_arena
  );
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(LoopLayerParams, maxloopiterations_)
      + sizeof(LoopLayerParams::maxloopiterations_)
      - PROTOBUF_FIELD_OFFSET(LoopLayerParams, conditionnetwork_)>(
          reinterpret_cast<char*>(&conditionnetwork_),
          reinterpret_cast<char*>(&other->conditionnetwork_));
}